

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
::try_emplace_impl<google::protobuf::compiler::SCC_const*const&>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
          *this,SCC **k)

{
  tuple<> local_21;
  tuple<const_google::protobuf::compiler::SCC_*const_&> local_20;
  
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
  ::find_or_prepare_insert<google::protobuf::compiler::SCC_const*>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.super__Tuple_impl<0UL,_const_google::protobuf::compiler::SCC_*const_&>.
    super__Head_base<0UL,_const_google::protobuf::compiler::SCC_*const_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_google::protobuf::compiler::SCC_*const_&>)
         (_Tuple_impl<0UL,_const_google::protobuf::compiler::SCC_*const_&>)k;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::compiler::SCC_const*const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }